

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.h
# Opt level: O0

void __thiscall TRM::Vertex::Vertex(Vertex *this,vec2 *p)

{
  vec2 *p_local;
  Vertex *this_local;
  
  Object::Object(&this->super_Object);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Vertex_00115ce8;
  this->prev = (Vertex *)0x0;
  this->next = (Vertex *)0x0;
  memset(&this->edge_above,0,0x10);
  LinkedList<TRM::Edge>::LinkedList(&this->edge_above);
  memset(&this->edge_below,0,0x10);
  LinkedList<TRM::Edge>::LinkedList(&this->edge_below);
  this->left = (Edge *)0x0;
  this->right = (Edge *)0x0;
  this->point = *p;
  return;
}

Assistant:

Vertex(glm::vec2 const& p) : point(p) {}